

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p0709a.cpp
# Opt level: O1

error safe_divide(int i,int j)

{
  value_type vVar1;
  error eVar2;
  
  if (j == 0) {
    vVar1 = 1;
  }
  else {
    vVar1 = 2;
    if (j != -1 || i != -0x80000000) {
      vVar1 = 3;
      if (i % j == 0) {
        std::terminate();
      }
    }
  }
  eVar2.super_status_code<system_error2::detail::erased<long,_true>_>.
  super_mixin<system_error2::detail::status_code_storage<system_error2::detail::erased<long,_true>_>,_system_error2::detail::erased<long,_true>_>
  .super_status_code_storage<system_error2::detail::erased<long,_true>_>._value = vVar1;
  eVar2.super_status_code<system_error2::detail::erased<long,_true>_>.
  super_mixin<system_error2::detail::status_code_storage<system_error2::detail::erased<long,_true>_>,_system_error2::detail::erased<long,_true>_>
  .super_status_code_storage<system_error2::detail::erased<long,_true>_>.super_status_code<void>.
  _domain = &arithmetic_errc_domain.super_status_code_domain;
  return (error)eVar2.super_status_code<system_error2::detail::erased<long,_true>_>.
                super_mixin<system_error2::detail::status_code_storage<system_error2::detail::erased<long,_true>_>,_system_error2::detail::erased<long,_true>_>
                .super_status_code_storage<system_error2::detail::erased<long,_true>_>;
}

Assistant:

error safe_divide(int i, int j)
{
  if(j == 0)
    return arithmetic_errc::divide_by_zero;
  if(i == INT_MIN && j == -1)
    return arithmetic_errc::integer_divide_overflows;
  if(i % j != 0)
    return arithmetic_errc::not_integer_division;
  return arithmetic_errc::success;
}